

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O1

void ncnn::im2col_sgemm_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  void *pvVar6;
  size_t sVar7;
  void *pvVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  byte bVar15;
  byte bVar16;
  int *piVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  undefined1 *puVar25;
  ulong *puVar26;
  long lVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  ulong *puVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  undefined1 (*pauVar34) [16];
  void *pvVar35;
  int iVar36;
  long lVar37;
  size_t sVar38;
  undefined1 (*pauVar39) [16];
  uint uVar40;
  undefined1 (*pauVar41) [16];
  long lVar42;
  undefined1 (*pauVar43) [16];
  undefined1 *puVar44;
  undefined1 (*pauVar45) [16];
  int iVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  void *pvVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  undefined1 (*pauVar54) [16];
  ushort uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar64 [16];
  undefined1 auVar63 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined8 uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  long local_d8;
  long local_d0;
  Mat local_a8;
  ulong local_58;
  ulong local_50;
  Mat *local_48;
  ulong local_40;
  ulong local_38;
  undefined1 auVar59 [16];
  
  uVar5 = bottom_im2col->w;
  iVar46 = bottom_im2col->h;
  uVar40 = bottom_im2col->c;
  lVar47 = (long)(int)uVar40;
  local_58 = (ulong)top_blob->c;
  local_a8.cstep = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize = 0;
  local_a8.elempack = 0;
  local_a8.allocator = (Allocator *)0x0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.d = 0;
  local_a8.c = 0;
  iVar33 = iVar46;
  uVar18 = uVar5;
  if (lVar47 < 4) {
    uVar22 = uVar40;
    if ((int)uVar5 < 4) {
      iVar23 = 1;
      sVar38 = 1;
      if ((int)uVar5 < 2) goto LAB_00203b80;
      iVar33 = iVar46 * 2;
      uVar18 = (uVar5 & 1) + 1;
    }
    else {
      uVar18 = (uVar5 & 1) + (uVar5 >> 2) + (uint)((uVar5 >> 1 & 1) != 0);
      iVar33 = iVar46 * 4;
    }
    iVar23 = 1;
    sVar38 = 1;
  }
  else {
    if ((int)uVar5 < 4) {
      if ((int)uVar5 < 2) {
        iVar23 = 4;
        sVar38 = 4;
        uVar22 = (uVar40 & 3) + (uVar40 >> 2);
        goto LAB_00203b80;
      }
      iVar33 = iVar46 * 2;
      uVar22 = (uVar40 & 3) + (uVar40 >> 2);
      uVar18 = (uVar5 & 1) + 1;
    }
    else {
      iVar33 = iVar46 * 4;
      uVar22 = (uVar40 & 3) + (uVar40 >> 2);
      uVar18 = (uVar5 & 1) + (uVar5 >> 2) + (uint)((uVar5 >> 1 & 1) != 0);
    }
    iVar23 = 4;
    sVar38 = 4;
  }
LAB_00203b80:
  local_48 = top_blob;
  Mat::create(&local_a8,iVar33,uVar22,uVar18,sVar38,iVar23,opt->workspace_allocator);
  local_50 = (ulong)uVar40;
  uVar19 = (ulong)(int)uVar5;
  uVar18 = (int)uVar5 >> 2;
  if (0 < (int)uVar18) {
    local_40 = (ulong)uVar18;
    local_d8 = 1;
    lVar42 = 3;
    local_d0 = 0;
    uVar52 = 0;
    do {
      puVar44 = (undefined1 *)(local_a8.cstep * uVar52 * local_a8.elemsize + (long)local_a8.data);
      if ((int)uVar40 < 4) {
        uVar20 = 0;
      }
      else {
        lVar27 = 3;
        lVar51 = 2;
        lVar31 = 1;
        uVar21 = 0;
        do {
          if (0 < iVar46) {
            pvVar6 = bottom_im2col->data;
            lVar49 = bottom_im2col->cstep * bottom_im2col->elemsize;
            lVar24 = lVar49 * lVar27 + local_d8;
            lVar32 = lVar49 * lVar51 + local_d8;
            lVar53 = lVar49 * uVar21 + local_d0;
            lVar49 = lVar49 * lVar31 + lVar42;
            lVar37 = 0;
            iVar33 = iVar46;
            do {
              *puVar44 = *(undefined1 *)((long)pvVar6 + lVar37 + lVar53);
              puVar44[1] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar49 + -3);
              puVar44[2] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar32 + -1);
              puVar44[3] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar24 + -1);
              puVar44[4] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar53 + 1);
              puVar44[5] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar49 + -2);
              puVar44[6] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar32);
              puVar44[7] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar24);
              puVar44[8] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar53 + 2);
              puVar44[9] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar49 + -1);
              puVar44[10] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar32 + 1);
              puVar44[0xb] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar24 + 1);
              puVar44[0xc] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar53 + 3);
              puVar44[0xd] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar49);
              puVar44[0xe] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar32 + 2);
              puVar44[0xf] = *(undefined1 *)((long)pvVar6 + lVar37 + lVar24 + 2);
              puVar44 = puVar44 + 0x10;
              lVar37 = lVar37 + uVar19;
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar20 = uVar21 + 4;
          lVar24 = uVar21 + 7;
          lVar27 = lVar27 + 4;
          lVar51 = lVar51 + 4;
          lVar31 = lVar31 + 4;
          uVar21 = uVar20;
          local_38 = uVar52;
        } while (lVar24 < lVar47);
      }
      if ((int)uVar20 < (int)uVar40) {
        uVar20 = uVar20 & 0xffffffff;
        do {
          if (0 < iVar46) {
            puVar25 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 + lVar42);
            iVar33 = iVar46;
            do {
              *puVar44 = puVar25[-3];
              puVar44[1] = puVar25[-2];
              puVar44[2] = puVar25[-1];
              puVar44[3] = *puVar25;
              puVar44 = puVar44 + 4;
              puVar25 = puVar25 + uVar19;
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != local_50);
      }
      uVar52 = uVar52 + 1;
      local_d8 = local_d8 + 4;
      local_d0 = local_d0 + 4;
      lVar42 = lVar42 + 4;
    } while (uVar52 != local_40);
  }
  uVar52 = uVar19 & 0xfffffffffffffffc;
  if ((uVar5 >> 1 & 1) != 0) {
    puVar44 = (undefined1 *)
              ((long)(int)uVar18 * local_a8.cstep * local_a8.elemsize + (long)local_a8.data);
    uVar20 = 0;
    if (3 < (int)uVar40) {
      lVar42 = 1;
      lVar27 = 2;
      lVar31 = 3;
      uVar21 = 0;
      do {
        if (0 < iVar46) {
          pvVar6 = bottom_im2col->data;
          lVar32 = bottom_im2col->cstep * bottom_im2col->elemsize;
          lVar51 = (long)pvVar6 + lVar32 * uVar21 + 1;
          lVar24 = (long)pvVar6 + lVar32 * lVar42 + 1;
          lVar53 = (long)pvVar6 + lVar32 * lVar27 + 1;
          lVar32 = (long)pvVar6 + lVar32 * lVar31 + 1;
          iVar33 = iVar46;
          do {
            *puVar44 = *(undefined1 *)(lVar51 + -1 + uVar52);
            puVar44[1] = *(undefined1 *)(lVar24 + -1 + uVar52);
            puVar44[2] = *(undefined1 *)(lVar53 + -1 + uVar52);
            puVar44[3] = *(undefined1 *)(lVar32 + -1 + uVar52);
            puVar44[4] = *(undefined1 *)(lVar51 + uVar52);
            puVar44[5] = *(undefined1 *)(lVar24 + uVar52);
            puVar44[6] = *(undefined1 *)(lVar53 + uVar52);
            puVar44[7] = *(undefined1 *)(lVar32 + uVar52);
            puVar44 = puVar44 + 8;
            lVar51 = lVar51 + uVar19;
            lVar24 = lVar24 + uVar19;
            lVar53 = lVar53 + uVar19;
            lVar32 = lVar32 + uVar19;
            iVar33 = iVar33 + -1;
          } while (iVar33 != 0);
        }
        uVar20 = uVar21 + 4;
        lVar51 = uVar21 + 7;
        lVar42 = lVar42 + 4;
        lVar27 = lVar27 + 4;
        lVar31 = lVar31 + 4;
        uVar21 = uVar20;
      } while (lVar51 < lVar47);
    }
    if ((int)uVar20 < (int)uVar40) {
      uVar20 = uVar20 & 0xffffffff;
      do {
        if (0 < iVar46) {
          puVar25 = (undefined1 *)
                    ((long)bottom_im2col->data +
                    bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 + uVar52 + 1);
          iVar33 = iVar46;
          do {
            *puVar44 = puVar25[-1];
            puVar44[1] = *puVar25;
            puVar44 = puVar44 + 2;
            puVar25 = puVar25 + uVar19;
            iVar33 = iVar33 + -1;
          } while (iVar33 != 0);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != local_50);
    }
  }
  iVar33 = (int)uVar52 + (uVar5 >> 1 & 1) * 2;
  if (iVar33 < (int)uVar5) {
    uVar20 = (ulong)iVar33;
    local_d8 = 0;
    uVar52 = uVar20;
    do {
      uVar18 = (uint)uVar52;
      uVar22 = uVar18 + 3;
      if (-1 < (int)uVar18) {
        uVar22 = uVar18;
      }
      puVar44 = (undefined1 *)
                ((long)(int)((uVar18 - (((uint)(uVar52 >> 0x1f) & 1) + uVar18 & 0xfffffffe)) +
                             ((int)uVar22 >> 2) + (int)(uVar18 - (uVar22 & 0xfffffffc)) / 2) *
                 local_a8.cstep * local_a8.elemsize + (long)local_a8.data);
      if ((int)uVar40 < 4) {
        uVar21 = 0;
      }
      else {
        lVar42 = 1;
        lVar27 = 2;
        lVar31 = 3;
        uVar28 = 0;
        do {
          if (0 < iVar46) {
            pvVar6 = bottom_im2col->data;
            lVar51 = bottom_im2col->cstep * bottom_im2col->elemsize;
            lVar53 = (long)pvVar6 + lVar51 * uVar28 + local_d8;
            lVar32 = (long)pvVar6 + lVar51 * lVar42 + local_d8;
            lVar24 = (long)pvVar6 + lVar51 * lVar27 + local_d8;
            lVar51 = (long)pvVar6 + lVar51 * lVar31 + local_d8;
            iVar33 = iVar46;
            do {
              *puVar44 = *(undefined1 *)(lVar53 + uVar20);
              puVar44[1] = *(undefined1 *)(lVar32 + uVar20);
              puVar44[2] = *(undefined1 *)(lVar24 + uVar20);
              puVar44[3] = *(undefined1 *)(lVar51 + uVar20);
              puVar44 = puVar44 + 4;
              lVar53 = lVar53 + uVar19;
              lVar32 = lVar32 + uVar19;
              lVar24 = lVar24 + uVar19;
              lVar51 = lVar51 + uVar19;
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar21 = uVar28 + 4;
          lVar51 = uVar28 + 7;
          lVar42 = lVar42 + 4;
          lVar27 = lVar27 + 4;
          lVar31 = lVar31 + 4;
          uVar28 = uVar21;
        } while (lVar51 < lVar47);
      }
      if ((int)uVar21 < (int)uVar40) {
        uVar21 = uVar21 & 0xffffffff;
        do {
          if (0 < iVar46) {
            puVar25 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar52 + bottom_im2col->cstep * uVar21 * bottom_im2col->elemsize);
            iVar33 = iVar46;
            do {
              *puVar44 = *puVar25;
              puVar44 = puVar44 + 1;
              puVar25 = puVar25 + uVar19;
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != local_50);
      }
      uVar52 = uVar52 + 1;
      local_d8 = local_d8 + 1;
    } while ((long)uVar52 < (long)uVar19);
  }
  uVar18 = (int)local_58 >> 2;
  if (0 < (int)uVar18) {
    uVar22 = uVar40 + 3;
    if (-1 < (int)uVar40) {
      uVar22 = uVar40;
    }
    iVar33 = ((int)uVar22 >> 2) * iVar46;
    iVar23 = ((int)uVar40 % 4) * iVar46;
    uVar52 = 0;
    do {
      sVar38 = local_48->cstep;
      pvVar6 = local_48->data;
      sVar7 = local_48->elemsize;
      pauVar39 = (undefined1 (*) [16])(uVar52 * 4 * sVar38 * sVar7 + (long)pvVar6);
      pauVar41 = (undefined1 (*) [16])((uVar52 * 4 + 1) * sVar38 * sVar7 + (long)pvVar6);
      pauVar43 = (undefined1 (*) [16])((uVar52 * 4 + 2) * sVar38 * sVar7 + (long)pvVar6);
      pauVar45 = (undefined1 (*) [16])((uVar52 * 4 + 3) * sVar38 * sVar7 + (long)pvVar6);
      if ((int)uVar5 < 4) {
        uVar20 = 0;
      }
      else {
        uVar21 = 0;
        do {
          pauVar29 = (undefined1 (*) [16])
                     ((uVar21 >> 2) * local_a8.cstep * local_a8.elemsize + (long)local_a8.data);
          pauVar54 = (undefined1 (*) [16])
                     (kernel->cstep * uVar52 * kernel->elemsize + (long)kernel->data);
          auVar63 = ZEXT1664((undefined1  [16])0x0);
          if (iVar33 < 1) {
            auVar65 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar65 = ZEXT1664((undefined1  [16])0x0);
            auVar66 = ZEXT1664((undefined1  [16])0x0);
            auVar70 = ZEXT1664((undefined1  [16])0x0);
            iVar36 = iVar33;
            do {
              auVar61 = vpmovsxbw_avx2(*pauVar29);
              auVar76 = vpermq_avx2(auVar61,0x50);
              auVar12 = vpermq_avx2(auVar61,0xfa);
              auVar11 = vpmovsxbw_avx2(*pauVar54);
              auVar13 = vpermq_avx2(auVar61,5);
              auVar14 = vpermq_avx2(auVar61,0xaf);
              auVar61 = vpmaddwd_avx2(auVar11,auVar76);
              auVar61 = vpaddd_avx2(auVar61,auVar63._0_32_);
              auVar63 = ZEXT3264(auVar61);
              auVar76 = vpmaddwd_avx2(auVar13,auVar11);
              auVar76 = vpaddd_avx2(auVar76,auVar66._0_32_);
              auVar66 = ZEXT3264(auVar76);
              auVar12 = vpmaddwd_avx2(auVar11,auVar12);
              auVar12 = vpaddd_avx2(auVar12,auVar65._0_32_);
              auVar65 = ZEXT3264(auVar12);
              auVar11 = vpmaddwd_avx2(auVar11,auVar14);
              auVar11 = vpaddd_avx2(auVar11,auVar70._0_32_);
              auVar70 = ZEXT3264(auVar11);
              pauVar29 = pauVar29 + 1;
              pauVar54 = pauVar54 + 1;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
            auVar61 = vphaddd_avx2(auVar61,auVar76);
            auVar76 = vphaddd_avx2(auVar12,auVar11);
            auVar61 = vpermq_avx2(auVar61,0x9c);
            auVar65 = ZEXT3264(auVar61);
            auVar61 = vpermq_avx2(auVar76,0x9c);
            auVar63 = ZEXT3264(auVar61);
          }
          auVar56 = auVar63._0_16_;
          auVar58 = auVar65._0_16_;
          auVar57 = auVar65._16_16_;
          auVar64 = auVar63._16_16_;
          if (0 < iVar23) {
            lVar47 = 0;
            do {
              auVar58._8_8_ = 0;
              auVar58._0_8_ = *(ulong *)(*pauVar29 + lVar47 * 4);
              auVar58 = vpmovsxbw_avx(auVar58);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = *(ulong *)(*pauVar54 + lVar47 * 4);
              auVar56 = vpmovsxbw_avx(auVar56);
              auVar68 = vpshuflw_avx(auVar58,0x50);
              auVar68 = vpshufd_avx(auVar68,0x50);
              auVar73._0_8_ = auVar56._0_8_;
              auVar73._8_8_ = auVar73._0_8_;
              auVar71 = vpmullw_avx(auVar68,auVar73);
              auVar56 = vpmulhw_avx(auVar68,auVar73);
              auVar58 = vpshuflw_avx(auVar58,0xfa);
              auVar58 = vpshufd_avx(auVar58,0x50);
              auVar10 = vpmullw_avx(auVar58,auVar73);
              auVar68 = vpmulhw_avx(auVar58,auVar73);
              auVar58 = vpunpcklwd_avx(auVar71,auVar56);
              auVar58 = vpaddd_avx(auVar65._0_16_,auVar58);
              auVar65 = ZEXT1664(auVar58);
              auVar56 = vpunpckhwd_avx(auVar71,auVar56);
              auVar57 = vpaddd_avx(auVar57,auVar56);
              auVar56 = vpunpcklwd_avx(auVar10,auVar68);
              auVar56 = vpaddd_avx(auVar63._0_16_,auVar56);
              auVar63 = ZEXT1664(auVar56);
              auVar68 = vpunpckhwd_avx(auVar10,auVar68);
              auVar64 = vpaddd_avx(auVar64,auVar68);
              lVar47 = lVar47 + 1;
            } while (iVar23 != (int)lVar47);
          }
          auVar68 = vpunpckldq_avx(auVar58,auVar57);
          auVar71 = vpunpckldq_avx(auVar56,auVar64);
          auVar58 = vpunpckhdq_avx(auVar58,auVar57);
          auVar57 = vpunpckhdq_avx(auVar56,auVar64);
          auVar64 = vpunpcklqdq_avx(auVar68,auVar71);
          auVar56 = vpunpckhqdq_avx(auVar68,auVar71);
          auVar68 = vpunpcklqdq_avx(auVar58,auVar57);
          auVar58 = vpunpckhqdq_avx(auVar58,auVar57);
          *pauVar39 = auVar64;
          *pauVar41 = auVar56;
          *pauVar43 = auVar68;
          *pauVar45 = auVar58;
          pauVar39 = pauVar39 + 1;
          pauVar41 = pauVar41 + 1;
          pauVar43 = pauVar43 + 1;
          pauVar45 = pauVar45 + 1;
          uVar20 = uVar21 + 4;
          lVar47 = uVar21 + 7;
          uVar21 = uVar20;
        } while (lVar47 < (long)uVar19);
      }
      uVar22 = (uint)uVar20;
      if ((int)(uVar22 | 1) < (int)uVar5) {
        pauVar29 = (undefined1 (*) [16])
                   (kernel->cstep * uVar52 * kernel->elemsize + (long)kernel->data);
        do {
          uVar48 = (uint)uVar20;
          pauVar34 = (undefined1 (*) [16])
                     ((ulong)(((uint)(uVar20 >> 2) & 0x3fffffff) + (uint)((uVar48 >> 1 & 1) != 0)) *
                      local_a8.cstep * local_a8.elemsize + (long)local_a8.data);
          auVar63 = ZEXT1664((undefined1  [16])0x0);
          pauVar54 = pauVar29;
          if (0 < iVar33) {
            auVar65 = ZEXT1664((undefined1  [16])0x0);
            iVar36 = iVar33;
            do {
              auVar61 = vpmovsxbw_avx2(*pauVar34);
              auVar12 = vpermq_avx2(auVar61,0x50);
              auVar76 = vpmovsxbw_avx2(*pauVar54);
              auVar11 = vpermq_avx2(auVar61,5);
              auVar61 = vpmaddwd_avx2(auVar12,auVar76);
              auVar61 = vpaddd_avx2(auVar61,auVar63._0_32_);
              auVar63 = ZEXT3264(auVar61);
              auVar76 = vpmaddwd_avx2(auVar11,auVar76);
              auVar76 = vpaddd_avx2(auVar76,auVar65._0_32_);
              auVar65 = ZEXT3264(auVar76);
              pauVar34 = (undefined1 (*) [16])(*pauVar34 + 8);
              pauVar54 = pauVar54 + 1;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
            auVar61 = vphaddd_avx2(auVar61,auVar76);
            auVar61 = vpermq_avx2(auVar61,0x9c);
            auVar63 = ZEXT3264(auVar61);
          }
          auVar58 = auVar63._0_16_;
          auVar57 = auVar63._16_16_;
          if (0 < iVar23) {
            lVar47 = 0;
            do {
              auVar58 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar34 + lVar47 * 2)));
              auVar58 = vpshuflw_avx(auVar58,0x50);
              auVar56 = vpshufd_avx(auVar58,0x50);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = *(ulong *)(*pauVar54 + lVar47 * 4);
              auVar58 = vpmovsxbw_avx(auVar64);
              auVar68._0_8_ = auVar58._0_8_;
              auVar68._8_8_ = auVar68._0_8_;
              auVar64 = vpmullw_avx(auVar56,auVar68);
              auVar56 = vpmulhw_avx(auVar56,auVar68);
              auVar58 = vpunpcklwd_avx(auVar64,auVar56);
              auVar58 = vpaddd_avx(auVar63._0_16_,auVar58);
              auVar63 = ZEXT1664(auVar58);
              auVar56 = vpunpckhwd_avx(auVar64,auVar56);
              auVar57 = vpaddd_avx(auVar57,auVar56);
              lVar47 = lVar47 + 1;
            } while (iVar23 != (int)lVar47);
          }
          *(int *)*pauVar39 = auVar58._0_4_;
          *(int *)*pauVar41 = auVar58._4_4_;
          *(int *)*pauVar43 = auVar58._8_4_;
          *(int *)*pauVar45 = auVar58._12_4_;
          *(int *)(*pauVar39 + 4) = auVar57._0_4_;
          *(int *)(*pauVar41 + 4) = auVar57._4_4_;
          *(int *)(*pauVar43 + 4) = auVar57._8_4_;
          *(int *)(*pauVar45 + 4) = auVar57._12_4_;
          pauVar39 = (undefined1 (*) [16])(*pauVar39 + 8);
          pauVar41 = (undefined1 (*) [16])(*pauVar41 + 8);
          pauVar43 = (undefined1 (*) [16])(*pauVar43 + 8);
          pauVar45 = (undefined1 (*) [16])(*pauVar45 + 8);
          uVar22 = uVar48 + 2;
          uVar20 = (ulong)uVar22;
        } while ((int)(uVar48 + 3) < (int)uVar5);
      }
      if ((int)uVar22 < (int)uVar5) {
        pauVar29 = (undefined1 (*) [16])
                   (kernel->cstep * uVar52 * kernel->elemsize + (long)kernel->data);
        do {
          puVar30 = (ulong *)((ulong)((uVar22 & 1) + (uVar22 >> 2) + (uint)((uVar22 >> 1 & 1) != 0))
                              * local_a8.cstep * local_a8.elemsize + (long)local_a8.data);
          auVar63 = ZEXT1664((undefined1  [16])0x0);
          pauVar54 = pauVar29;
          if (0 < iVar33) {
            auVar65 = ZEXT1664((undefined1  [16])0x0);
            auVar66 = ZEXT1664((undefined1  [16])0x0);
            auVar70 = ZEXT1664((undefined1  [16])0x0);
            iVar36 = iVar33;
            do {
              auVar57._8_8_ = 0;
              auVar57._0_8_ = *puVar30;
              auVar56 = vpmovsxbw_avx(auVar57);
              auVar58 = *pauVar54;
              auVar57 = vpcmpgtb_avx((undefined1  [16])0x0,auVar58);
              auVar64 = vpunpcklbw_avx(auVar58,auVar57);
              auVar58 = vpunpckhbw_avx(auVar58,auVar57);
              auVar71._0_8_ = auVar56._0_8_;
              auVar71._8_8_ = auVar71._0_8_;
              auVar56 = vpmullw_avx(auVar64,auVar71);
              auVar57 = vpmulhw_avx(auVar64,auVar71);
              auVar68 = vpmullw_avx(auVar71,auVar58);
              auVar64 = vpmulhw_avx(auVar71,auVar58);
              auVar58 = vpunpcklwd_avx(auVar56,auVar57);
              auVar58 = vpaddd_avx(auVar70._0_16_,auVar58);
              auVar70 = ZEXT1664(auVar58);
              auVar57 = vpunpckhwd_avx(auVar56,auVar57);
              auVar57 = vpaddd_avx(auVar66._0_16_,auVar57);
              auVar66 = ZEXT1664(auVar57);
              auVar56 = vpunpcklwd_avx(auVar68,auVar64);
              auVar56 = vpaddd_avx(auVar65._0_16_,auVar56);
              auVar65 = ZEXT1664(auVar56);
              auVar64 = vpunpckhwd_avx(auVar68,auVar64);
              auVar64 = vpaddd_avx(auVar63._0_16_,auVar64);
              auVar63 = ZEXT1664(auVar64);
              puVar30 = (ulong *)((long)puVar30 + 4);
              pauVar54 = pauVar54 + 1;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
            auVar68 = vpunpckldq_avx(auVar58,auVar57);
            auVar71 = vpunpckldq_avx(auVar56,auVar64);
            auVar57 = vpunpckhdq_avx(auVar58,auVar57);
            auVar56 = vpunpckhdq_avx(auVar56,auVar64);
            auVar64 = vpunpcklqdq_avx(auVar68,auVar71);
            auVar58 = vpunpckhqdq_avx(auVar68,auVar71);
            auVar58 = vpaddd_avx(auVar64,auVar58);
            auVar64 = vpunpcklqdq_avx(auVar57,auVar56);
            auVar57 = vpunpckhqdq_avx(auVar57,auVar56);
            auVar57 = vpaddd_avx(auVar57,auVar64);
            auVar58 = vpaddd_avx(auVar58,auVar57);
            auVar63 = ZEXT1664(auVar58);
          }
          auVar58 = auVar63._0_16_;
          if (0 < iVar23) {
            lVar47 = 0;
            do {
              auVar56 = vpbroadcastw_avx512vl();
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *(ulong *)(*pauVar54 + lVar47 * 4);
              auVar58 = vpmovsxbw_avx(auVar10);
              auVar57 = vpmullw_avx(auVar56,auVar58);
              auVar58 = vpmulhw_avx(auVar56,auVar58);
              auVar58 = vpunpcklwd_avx(auVar57,auVar58);
              auVar58 = vpaddd_avx(auVar63._0_16_,auVar58);
              auVar63 = ZEXT1664(auVar58);
              lVar47 = lVar47 + 1;
            } while (iVar23 != (int)lVar47);
          }
          *(int *)*pauVar39 = auVar58._0_4_;
          *(int *)*pauVar41 = auVar58._4_4_;
          *(int *)*pauVar43 = auVar58._8_4_;
          *(int *)*pauVar45 = auVar58._12_4_;
          pauVar39 = (undefined1 (*) [16])(*pauVar39 + 4);
          pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
          pauVar43 = (undefined1 (*) [16])(*pauVar43 + 4);
          pauVar45 = (undefined1 (*) [16])(*pauVar45 + 4);
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar5);
      }
      uVar52 = uVar52 + 1;
    } while (uVar52 != uVar18);
  }
  uVar52 = local_58 & 0xfffffffffffffffc;
  if ((int)uVar52 != (int)local_58) {
    pvVar6 = local_48->data;
    sVar38 = local_48->cstep;
    sVar7 = local_48->elemsize;
    lVar42 = local_a8.cstep * local_a8.elemsize;
    pvVar8 = kernel->data;
    lVar47 = kernel->cstep * kernel->elemsize;
    uVar18 = uVar40 + 3;
    if (-1 < (int)uVar40) {
      uVar18 = uVar40;
    }
    iVar33 = ((int)uVar18 >> 2) * iVar46;
    iVar46 = ((int)uVar40 % 4) * iVar46;
    auVar63 = vpbroadcastq_avx512f();
    auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pauVar39 = (undefined1 (*) [16])(sVar38 * sVar7 * uVar52 + (long)pvVar6);
      uVar40 = (uint)uVar52;
      if ((int)uVar5 < 4) {
        uVar20 = 0;
      }
      else {
        uVar18 = uVar40 + 3;
        if (-1 < (int)uVar40) {
          uVar18 = uVar40;
        }
        uVar21 = 0;
        do {
          pauVar41 = (undefined1 (*) [16])((uVar21 >> 2) * lVar42 + (long)local_a8.data);
          if (iVar33 < 1) {
            auVar70 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar70 = ZEXT1664((undefined1  [16])0x0);
            auVar72 = ZEXT1664((undefined1  [16])0x0);
            puVar30 = (ulong *)((int)(((int)uVar18 >> 2) + (uVar40 - (uVar18 & 0xfffffffc))) *
                                lVar47 + (long)pvVar8);
            iVar23 = iVar33;
            do {
              auVar61 = vpmovsxbw_avx2(*pauVar41);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *puVar30;
              auVar58 = vpmovsxbw_avx(auVar1);
              auVar76._0_8_ = auVar58._0_8_;
              auVar76._8_8_ = auVar76._0_8_;
              auVar76._16_8_ = auVar76._0_8_;
              auVar76._24_8_ = auVar76._0_8_;
              auVar12 = vpmullw_avx2(auVar76,auVar61);
              auVar76 = vpmulhw_avx2(auVar61,auVar76);
              auVar61 = vpunpcklwd_avx2(auVar12,auVar76);
              auVar61 = vpaddd_avx2(auVar72._0_32_,auVar61);
              auVar72 = ZEXT3264(auVar61);
              auVar76 = vpunpckhwd_avx2(auVar12,auVar76);
              auVar76 = vpaddd_avx2(auVar70._0_32_,auVar76);
              auVar70 = ZEXT3264(auVar76);
              pauVar41 = pauVar41 + 1;
              puVar30 = (ulong *)((long)puVar30 + 4);
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
            auVar58 = vpshufd_avx(auVar61._0_16_,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar61._0_16_);
            auVar57 = vpshufd_avx(auVar76._0_16_,0xee);
            auVar57 = vpaddd_avx(auVar57,auVar76._0_16_);
            auVar57 = vphaddd_avx(auVar58,auVar57);
            auVar58 = vpshufd_avx(auVar61._16_16_,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar61._16_16_);
            auVar56 = vphaddd_avx(auVar58,auVar58);
            auVar58 = vpshufd_avx(auVar76._16_16_,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar76._16_16_);
            auVar58 = vphaddd_avx(auVar58,auVar58);
            auVar57 = vpshufd_avx(auVar57,0xe8);
            auVar57 = vpunpcklqdq_avx(auVar57,auVar56);
            auVar69._0_4_ = auVar58._0_4_;
            auVar69._4_4_ = auVar69._0_4_;
            auVar69._8_4_ = auVar69._0_4_;
            auVar69._12_4_ = auVar69._0_4_;
            auVar58 = vpblendd_avx2(auVar57,auVar69,8);
            auVar70 = ZEXT1664(auVar58);
          }
          auVar58 = auVar70._0_16_;
          if (0 < iVar46) {
            lVar27 = 0;
            do {
              auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(*pauVar41 + lVar27 * 4)));
              auVar57 = vpbroadcastd_avx512vl();
              auVar58 = vpmulld_avx(auVar57,auVar58);
              auVar58 = vpaddd_avx(auVar58,auVar70._0_16_);
              auVar70 = ZEXT1664(auVar58);
              lVar27 = lVar27 + 1;
            } while (iVar46 != (int)lVar27);
          }
          *pauVar39 = auVar58;
          pauVar39 = pauVar39 + 1;
          uVar20 = uVar21 + 4;
          lVar27 = uVar21 + 7;
          uVar21 = uVar20;
        } while (lVar27 < (long)uVar19);
      }
      uVar18 = (uint)uVar20;
      if ((int)(uVar18 | 1) < (int)uVar5) {
        uVar22 = uVar40 + 3;
        if (-1 < (int)uVar40) {
          uVar22 = uVar40;
        }
        do {
          uVar48 = (uint)uVar20;
          puVar30 = (ulong *)((ulong)(((uint)(uVar20 >> 2) & 0x3fffffff) +
                                     (uint)((uVar48 >> 1 & 1) != 0)) * lVar42 + (long)local_a8.data)
          ;
          auVar70 = ZEXT1664((undefined1  [16])0x0);
          if (0 < iVar33) {
            auVar72 = ZEXT1664((undefined1  [16])0x0);
            puVar26 = (ulong *)((int)(((int)uVar22 >> 2) + (uVar40 - (uVar22 & 0xfffffffc))) *
                                lVar47 + (long)pvVar8);
            iVar23 = iVar33;
            do {
              auVar74._8_8_ = 0;
              auVar74._0_8_ = *puVar30;
              auVar58 = vpcmpgtb_avx((undefined1  [16])0x0,auVar74);
              auVar57 = vpunpcklbw_avx(auVar74,auVar58);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *puVar26;
              auVar58 = vpmovsxbw_avx(auVar2);
              auVar75._0_8_ = auVar58._0_8_;
              auVar75._8_8_ = auVar75._0_8_;
              auVar56 = vpmullw_avx(auVar75,auVar57);
              auVar57 = vpmulhw_avx(auVar57,auVar75);
              auVar58 = vpunpcklwd_avx(auVar56,auVar57);
              auVar58 = vpaddd_avx(auVar72._0_16_,auVar58);
              auVar72 = ZEXT1664(auVar58);
              auVar57 = vpunpckhwd_avx(auVar56,auVar57);
              auVar57 = vpaddd_avx(auVar70._0_16_,auVar57);
              auVar70 = ZEXT1664(auVar57);
              puVar30 = puVar30 + 1;
              puVar26 = (ulong *)((long)puVar26 + 4);
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
            auVar56 = vpshufd_avx(auVar58,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar56);
            auVar56 = vpshufd_avx(auVar57,0xee);
            auVar57 = vpaddd_avx(auVar57,auVar56);
            auVar58 = vphaddd_avx(auVar58,auVar57);
            auVar58 = vpshufd_avx(auVar58,0xe8);
            auVar70 = ZEXT1664(auVar58);
          }
          uVar67 = auVar70._0_8_;
          if (0 < iVar46) {
            lVar27 = 0;
            do {
              auVar58 = vpmovsxbd_avx(ZEXT216(*(ushort *)((long)puVar30 + lVar27 * 2)));
              auVar57 = vpbroadcastd_avx512vl();
              auVar58 = vpmulld_avx(auVar57,auVar58);
              auVar58 = vpaddd_avx(auVar58,auVar70._0_16_);
              auVar70 = ZEXT1664(auVar58);
              uVar67 = auVar58._0_8_;
              lVar27 = lVar27 + 1;
            } while (iVar46 != (int)lVar27);
          }
          *(undefined8 *)*pauVar39 = uVar67;
          pauVar39 = (undefined1 (*) [16])((long)*pauVar39 + 8);
          uVar18 = uVar48 + 2;
          uVar20 = (ulong)uVar18;
        } while ((int)(uVar48 + 3) < (int)uVar5);
      }
      if ((int)uVar18 < (int)uVar5) {
        uVar22 = uVar40 + 3;
        if (-1 < (int)uVar40) {
          uVar22 = uVar40;
        }
        pvVar35 = (void *)((int)(((int)uVar22 >> 2) + (uVar40 - (uVar22 & 0xfffffffc))) * lVar47 +
                          (long)pvVar8);
        do {
          if (iVar33 < 1) {
            lVar27 = (ulong)((uVar18 & 1) + (uVar18 >> 2) + (uint)((uVar18 >> 1 & 1) != 0)) * lVar42
            ;
            uVar40 = 0;
            pvVar50 = pvVar35;
          }
          else {
            lVar27 = (ulong)((uVar18 >> 2) + (uVar18 & 1) + (uint)((uVar18 >> 1 & 1) != 0)) * lVar42
            ;
            auVar70 = ZEXT1664((undefined1  [16])0x0);
            lVar31 = 0;
            lVar51 = 0;
            do {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)((long)local_a8.data + lVar51 * 4 + lVar27);
              auVar58 = vpmovsxbw_avx(auVar3);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)((long)pvVar35 + lVar51 * 4);
              auVar57 = vpmovsxbw_avx(auVar4);
              auVar56 = vpmullw_avx(auVar57,auVar58);
              auVar58 = vpmulhw_avx(auVar58,auVar57);
              auVar58 = vpunpcklwd_avx(auVar56,auVar58);
              auVar58 = vpaddd_avx(auVar70._0_16_,auVar58);
              auVar70 = ZEXT1664(auVar58);
              lVar51 = lVar51 + 1;
              lVar31 = lVar31 + -4;
            } while (iVar33 != (int)lVar51);
            auVar58 = vphaddd_avx(auVar58,auVar58);
            auVar58 = vphaddd_avx(auVar58,auVar58);
            uVar40 = auVar58._0_4_;
            lVar27 = lVar27 - lVar31;
            pvVar50 = (void *)((long)pvVar35 - lVar31);
          }
          if (0 < iVar46) {
            auVar70 = ZEXT464(uVar40);
            uVar20 = 0;
            do {
              auVar72 = vmovdqa64_avx512f(auVar70);
              auVar70 = vpbroadcastq_avx512f();
              auVar62 = vporq_avx512f(auVar70,auVar65);
              auVar70 = vporq_avx512f(auVar70,auVar66);
              uVar67 = vpcmpuq_avx512f(auVar70,auVar63,2);
              bVar15 = (byte)uVar67;
              uVar67 = vpcmpuq_avx512f(auVar62,auVar63,2);
              bVar16 = (byte)uVar67;
              uVar55 = CONCAT11(bVar16,bVar15);
              auVar58 = vmovdqu8_avx512vl(*(undefined1 (*) [16])
                                           ((long)local_a8.data + uVar20 + lVar27));
              auVar59[1] = ((byte)(uVar55 >> 1) & 1) * auVar58[1];
              auVar59[0] = (bVar15 & 1) * auVar58[0];
              auVar59[2] = ((byte)(uVar55 >> 2) & 1) * auVar58[2];
              auVar59[3] = ((byte)(uVar55 >> 3) & 1) * auVar58[3];
              auVar59[4] = ((byte)(uVar55 >> 4) & 1) * auVar58[4];
              auVar59[5] = ((byte)(uVar55 >> 5) & 1) * auVar58[5];
              auVar59[6] = ((byte)(uVar55 >> 6) & 1) * auVar58[6];
              auVar59[7] = ((byte)(uVar55 >> 7) & 1) * auVar58[7];
              auVar59[8] = (bVar16 & 1) * auVar58[8];
              auVar59[9] = (bVar16 >> 1 & 1) * auVar58[9];
              auVar59[10] = (bVar16 >> 2 & 1) * auVar58[10];
              auVar59[0xb] = (bVar16 >> 3 & 1) * auVar58[0xb];
              auVar59[0xc] = (bVar16 >> 4 & 1) * auVar58[0xc];
              auVar59[0xd] = (bVar16 >> 5 & 1) * auVar58[0xd];
              auVar59[0xe] = (bVar16 >> 6 & 1) * auVar58[0xe];
              auVar59[0xf] = -((char)bVar16 >> 7) * auVar58[0xf];
              auVar58 = vmovdqu8_avx512vl(*(undefined1 (*) [16])((long)pvVar50 + uVar20));
              auVar60[1] = ((byte)(uVar55 >> 1) & 1) * auVar58[1];
              auVar60[0] = (bVar15 & 1) * auVar58[0];
              auVar60[2] = ((byte)(uVar55 >> 2) & 1) * auVar58[2];
              auVar60[3] = ((byte)(uVar55 >> 3) & 1) * auVar58[3];
              auVar60[4] = ((byte)(uVar55 >> 4) & 1) * auVar58[4];
              auVar60[5] = ((byte)(uVar55 >> 5) & 1) * auVar58[5];
              auVar60[6] = ((byte)(uVar55 >> 6) & 1) * auVar58[6];
              auVar60[7] = ((byte)(uVar55 >> 7) & 1) * auVar58[7];
              auVar60[8] = (bVar16 & 1) * auVar58[8];
              auVar60[9] = (bVar16 >> 1 & 1) * auVar58[9];
              auVar60[10] = (bVar16 >> 2 & 1) * auVar58[10];
              auVar60[0xb] = (bVar16 >> 3 & 1) * auVar58[0xb];
              auVar60[0xc] = (bVar16 >> 4 & 1) * auVar58[0xc];
              auVar60[0xd] = (bVar16 >> 5 & 1) * auVar58[0xd];
              auVar60[0xe] = (bVar16 >> 6 & 1) * auVar58[0xe];
              auVar60[0xf] = -((char)bVar16 >> 7) * auVar58[0xf];
              auVar70 = vpmovsxbd_avx512f(auVar59);
              auVar62 = vpmovsxbd_avx512f(auVar60);
              auVar70 = vpmulld_avx512f(auVar62,auVar70);
              auVar70 = vpaddd_avx512f(auVar70,auVar72);
              uVar20 = uVar20 + 0x10;
            } while ((iVar46 + 0xfU & 0xfffffff0) != uVar20);
            auVar70 = vmovdqa32_avx512f(auVar70);
            auVar62._0_4_ =
                 (uint)(bVar15 & 1) * auVar70._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar72._0_4_;
            bVar9 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar9 * auVar70._4_4_ | (uint)!bVar9 * auVar72._4_4_;
            bVar9 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar9 * auVar70._8_4_ | (uint)!bVar9 * auVar72._8_4_;
            bVar9 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar62._12_4_ = (uint)bVar9 * auVar70._12_4_ | (uint)!bVar9 * auVar72._12_4_;
            bVar9 = (bool)((byte)(uVar55 >> 4) & 1);
            auVar62._16_4_ = (uint)bVar9 * auVar70._16_4_ | (uint)!bVar9 * auVar72._16_4_;
            bVar9 = (bool)((byte)(uVar55 >> 5) & 1);
            auVar62._20_4_ = (uint)bVar9 * auVar70._20_4_ | (uint)!bVar9 * auVar72._20_4_;
            bVar9 = (bool)((byte)(uVar55 >> 6) & 1);
            auVar62._24_4_ = (uint)bVar9 * auVar70._24_4_ | (uint)!bVar9 * auVar72._24_4_;
            bVar9 = (bool)((byte)(uVar55 >> 7) & 1);
            auVar62._28_4_ = (uint)bVar9 * auVar70._28_4_ | (uint)!bVar9 * auVar72._28_4_;
            auVar62._32_4_ =
                 (uint)(bVar16 & 1) * auVar70._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar72._32_4_;
            bVar9 = (bool)(bVar16 >> 1 & 1);
            auVar62._36_4_ = (uint)bVar9 * auVar70._36_4_ | (uint)!bVar9 * auVar72._36_4_;
            bVar9 = (bool)(bVar16 >> 2 & 1);
            auVar62._40_4_ = (uint)bVar9 * auVar70._40_4_ | (uint)!bVar9 * auVar72._40_4_;
            bVar9 = (bool)(bVar16 >> 3 & 1);
            auVar62._44_4_ = (uint)bVar9 * auVar70._44_4_ | (uint)!bVar9 * auVar72._44_4_;
            bVar9 = (bool)(bVar16 >> 4 & 1);
            auVar62._48_4_ = (uint)bVar9 * auVar70._48_4_ | (uint)!bVar9 * auVar72._48_4_;
            bVar9 = (bool)(bVar16 >> 5 & 1);
            auVar62._52_4_ = (uint)bVar9 * auVar70._52_4_ | (uint)!bVar9 * auVar72._52_4_;
            bVar9 = (bool)(bVar16 >> 6 & 1);
            auVar62._56_4_ = (uint)bVar9 * auVar70._56_4_ | (uint)!bVar9 * auVar72._56_4_;
            auVar62._60_4_ =
                 (uint)(bVar16 >> 7) * auVar70._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar72._60_4_;
            auVar61 = vextracti64x4_avx512f(auVar62,1);
            auVar70 = vpaddd_avx512f(auVar62,ZEXT3264(auVar61));
            auVar58 = vpaddd_avx(auVar70._0_16_,auVar70._16_16_);
            auVar57 = vpshufd_avx(auVar58,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar57);
            auVar57 = vpshufd_avx(auVar58,0x55);
            auVar58 = vpaddd_avx(auVar58,auVar57);
            uVar40 = auVar58._0_4_;
          }
          *(uint *)*pauVar39 = uVar40;
          pauVar39 = (undefined1 (*) [16])((long)*pauVar39 + 4);
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar5);
      }
      uVar52 = uVar52 + 1;
    } while ((long)uVar52 < (long)local_58);
  }
  piVar17 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __SSE2__
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#else // __SSE2__
    tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            signed char* tmpptr = tmp.channel(i);

            int q = 0;
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#endif // __SSE2__

    int nn_outch = 0;
    int remain_outch_start = 0;

#if __SSE2__
    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_madd_epi16(_val23_16, _w01_16));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_madd_epi16(_val32_16, _w01_16));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val0123 = _mm_cvtepi8_epi16(_val0123);
#else
                __m128i _extval0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                _val0123 = _mm_unpacklo_epi8(_val0123, _extval0123);
#endif

                __m128i _val01 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(1, 1, 0, 0));

                _val01 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _val23 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(3, 3, 2, 2));

                _val23 = _mm_shuffle_epi32(_val23, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum10);
                _tmp1 = _mm_unpacklo_epi32(_sum20, _sum30);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum10);
                _tmp3 = _mm_unpackhi_epi32(_sum20, _sum30);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum10 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum20 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum30 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)outptr1, _sum10);
            _mm_storeu_si128((__m128i*)outptr2, _sum20);
            _mm_storeu_si128((__m128i*)outptr3, _sum30);
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                    _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                    _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                    _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
#if __SSSE3__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                __m128i _sum00_sh = _mm_shuffle_epi32(_sum00, 216);
                __m128i _sum01_sh = _mm_shuffle_epi32(_sum01, 216);
                __m128i _sum10_sh = _mm_shuffle_epi32(_sum10, 216);
                __m128i _sum11_sh = _mm_shuffle_epi32(_sum11, 216);

                _sum00 = _mm_unpacklo_epi64(_sum00_sh, _sum01_sh);
                _sum01 = _mm_unpackhi_epi64(_sum00_sh, _sum01_sh);
                _sum10 = _mm_unpacklo_epi64(_sum10_sh, _sum11_sh);
                _sum11 = _mm_unpackhi_epi64(_sum10_sh, _sum11_sh);

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=99754
                // gcc incorrectly put 32bit to tail with _mm_loadu_si32  :(
                // 0 1 2 3 x x x x x x x x x x x x
                // x x x x x x x x x x x x 0 1 2 3
                // __m128i _w0123 = _mm_loadu_si32(kptr0);
                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __SSE2__
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;
            int sum2 = 0;
            int sum3 = 0;

            if (nn4 > 0)
            {
                __m256i _sum0_2 = _mm256_setzero_si256();
                __m256i _sum1_3 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
                    _w = _mm_unpacklo_epi64(_w, _w);
                    __m256i _ww = _mm256_inserti128_si256(_mm256_castsi128_si256(_w), _w, 1);

                    __m256i _sl0_1 = _mm256_mullo_epi16(_val01_16, _ww);
                    __m256i _sh0_1 = _mm256_mulhi_epi16(_val01_16, _ww);

                    _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                    _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));

                    tmpptr += 16;
                    kptr0 += 4;
                }

                __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
                __m128i _sum1 = _mm256_extracti128_si256(_sum1_3, 0);
                __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
                __m128i _sum3 = _mm256_extracti128_si256(_sum1_3, 1);

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
                sum2 = _mm_reduce_add_epi32(_sum2);
                sum3 = _mm_reduce_add_epi32(_sum3);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char val2 = tmpptr[2];
                signed char val3 = tmpptr[3];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;
                sum2 += val2 * w;
                sum3 += val3 * w;

                tmpptr += 4;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0[2] = sum2;
            outptr0[3] = sum3;
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;

            if (nn4 > 0)
            {
                __m128i _sum0 = _mm_setzero_si128();
                __m128i _sum1 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val);
                    __m128i _val01 = _mm_unpacklo_epi8(_val, _extval);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif
                    _w = _mm_shuffle_epi32(_w, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _sl01 = _mm_mullo_epi16(_val01, _w);
                    __m128i _sh01 = _mm_mulhi_epi16(_val01, _w);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 8;
                    kptr0 += 4;
                }

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;

                tmpptr += 2;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum = 0;

            if (nn4 > 0)
            {
                __m128i _sum = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val = _mm_cvtepi8_epi16(_val0123);
#else
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                    __m128i _val = _mm_unpacklo_epi8(_val0123, _extval);
#endif

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif

                    __m128i _sl = _mm_mullo_epi16(_val, _w);
                    __m128i _sh = _mm_mulhi_epi16(_val, _w);

                    _sum = _mm_add_epi32(_sum, _mm_unpacklo_epi16(_sl, _sh));

                    tmpptr += 4;
                    kptr0 += 4;
                }

                sum = _mm_reduce_add_epi32(_sum);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#else  // __SSE2__
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i);
            const signed char* kptr0 = kernel.channel(p);

            int nn1 = inch * maxk;

            int sum = 0;
            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#endif // __SSE2__
    }
}